

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectedEnergyFirePdu.cpp
# Opt level: O1

void __thiscall
DIS::DirectedEnergyFirePdu::marshal(DirectedEnergyFirePdu *this,DataStream *dataStream)

{
  ulong uVar1;
  pointer pSVar2;
  long lVar3;
  StandardVariableSpecification x;
  StandardVariableSpecification local_58;
  
  WarfareFamilyPdu::marshal(&this->super_WarfareFamilyPdu,dataStream);
  EntityType::marshal(&this->_munitionType,dataStream);
  ClockTime::marshal(&this->_shotStartTime,dataStream);
  DataStream::operator<<(dataStream,this->_commulativeShotTime);
  Vector3Float::marshal(&this->_ApertureEmitterLocation,dataStream);
  DataStream::operator<<(dataStream,this->_apertureDiameter);
  DataStream::operator<<(dataStream,this->_wavelength);
  DataStream::operator<<(dataStream,this->_peakIrradiance);
  DataStream::operator<<(dataStream,this->_pulseRepetitionFrequency);
  DataStream::operator<<(dataStream,this->_pulseWidth);
  DataStream::operator<<(dataStream,this->_flags);
  DataStream::operator<<(dataStream,this->_pulseShape);
  DataStream::operator<<(dataStream,this->_padding1);
  DataStream::operator<<(dataStream,this->_padding2);
  DataStream::operator<<(dataStream,this->_padding3);
  DataStream::operator<<
            (dataStream,
             (short)((uint)(*(int *)&(this->_dERecords).
                                     super__Vector_base<DIS::StandardVariableSpecification,_std::allocator<DIS::StandardVariableSpecification>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->_dERecords).
                                    super__Vector_base<DIS::StandardVariableSpecification,_std::allocator<DIS::StandardVariableSpecification>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x3333);
  pSVar2 = (this->_dERecords).
           super__Vector_base<DIS::StandardVariableSpecification,_std::allocator<DIS::StandardVariableSpecification>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_dERecords).
      super__Vector_base<DIS::StandardVariableSpecification,_std::allocator<DIS::StandardVariableSpecification>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar2) {
    lVar3 = 0x10;
    uVar1 = 0;
    do {
      local_58._vptr_StandardVariableSpecification =
           (_func_int **)&PTR__StandardVariableSpecification_001b6130;
      local_58._numberOfStandardVariableRecords = *(unsigned_short *)((long)pSVar2 + lVar3 + -8);
      std::
      vector<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
      ::vector(&local_58._standardVariables,
               (vector<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
                *)((long)&pSVar2->_vptr_StandardVariableSpecification + lVar3));
      StandardVariableSpecification::marshal(&local_58,dataStream);
      StandardVariableSpecification::~StandardVariableSpecification(&local_58);
      uVar1 = uVar1 + 1;
      pSVar2 = (this->_dERecords).
               super__Vector_base<DIS::StandardVariableSpecification,_std::allocator<DIS::StandardVariableSpecification>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x28;
    } while (uVar1 < (ulong)(((long)(this->_dERecords).
                                    super__Vector_base<DIS::StandardVariableSpecification,_std::allocator<DIS::StandardVariableSpecification>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 3)
                            * -0x3333333333333333));
  }
  return;
}

Assistant:

void DirectedEnergyFirePdu::marshal(DataStream& dataStream) const
{
    WarfareFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _munitionType.marshal(dataStream);
    _shotStartTime.marshal(dataStream);
    dataStream << _commulativeShotTime;
    _ApertureEmitterLocation.marshal(dataStream);
    dataStream << _apertureDiameter;
    dataStream << _wavelength;
    dataStream << _peakIrradiance;
    dataStream << _pulseRepetitionFrequency;
    dataStream << _pulseWidth;
    dataStream << _flags;
    dataStream << _pulseShape;
    dataStream << _padding1;
    dataStream << _padding2;
    dataStream << _padding3;
    dataStream << ( unsigned short )_dERecords.size();

     for(size_t idx = 0; idx < _dERecords.size(); idx++)
     {
        StandardVariableSpecification x = _dERecords[idx];
        x.marshal(dataStream);
     }

}